

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O1

void ggml_cpu_init(void)

{
  float fVar1;
  undefined8 uVar2;
  int i;
  long lVar3;
  float fVar4;
  undefined1 auVar5 [16];
  ggml_init_params params;
  
  uVar2 = ggml_init();
  ggml_free(uVar2);
  ggml_critical_section_start();
  if (ggml_cpu_init_is_first_call == '\0') {
    ggml_time_us();
    lVar3 = 0;
    do {
      fVar1 = *(float *)(&ggml_table_f32_f16 + lVar3 * 4);
      auVar5 = vfmadd213ss_fma(ZEXT416((uint)(fVar1 * 0.044715)),ZEXT416((uint)fVar1),
                               SUB6416(ZEXT464(0x3f800000),0));
      fVar4 = tanhf(fVar1 * 0.7978846 * auVar5._0_4_);
      auVar5 = vcvtps2ph_f16c(ZEXT416((uint)((fVar4 + 1.0) * fVar1 * 0.5)),0);
      vpextrw_avx(auVar5,0);
      fVar4 = expf(fVar1 * -1.702);
      auVar5 = vcvtps2ph_f16c(ZEXT416((uint)((1.0 / (fVar4 + 1.0)) * fVar1)),0);
      vpextrw_avx(auVar5,0);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x10000);
    ggml_time_us();
    ggml_cpu_init_is_first_call = '\x01';
  }
  ggml_critical_section_end();
  return;
}

Assistant:

void ggml_cpu_init(void) {
    // needed to initialize f16 tables
    {
        struct ggml_init_params params = { 0, NULL, false };
        struct ggml_context * ctx = ggml_init(params);
        ggml_free(ctx);
    }

    ggml_critical_section_start();

    static bool is_first_call = true;

    if (is_first_call) {
        // initialize GELU, Quick GELU, SILU and EXP F32 tables
        {
            const uint64_t t_start = ggml_time_us(); UNUSED(t_start);

            for (int i = 0; i < (1 << 16); ++i) {
                union {
                    uint16_t u16;
                    ggml_fp16_t fp16;
                } u = {i};
                float f = GGML_FP16_TO_FP32(u.fp16);
                ggml_table_gelu_f16[i] = GGML_FP32_TO_FP16(ggml_gelu_f32(f));
                ggml_table_gelu_quick_f16[i] = GGML_FP32_TO_FP16(ggml_gelu_quick_f32(f));
            }

            const uint64_t t_end = ggml_time_us(); UNUSED(t_end);

            GGML_PRINT_DEBUG("%s: GELU, Quick GELU, SILU and EXP tables initialized in %f ms\n", __func__, (t_end - t_start)/1000.0);
        }

#if defined(__ARM_ARCH)
        ggml_init_arm_arch_features();
#endif

        is_first_call = false;
    }

    ggml_critical_section_end();
}